

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  Pager *pPager_00;
  Pager *pPager_1;
  int local_70;
  int nRet;
  int i_2;
  int nByte_1;
  Vdbe *pVdbe;
  HashElem *p;
  Schema *pSchema;
  int nByte;
  int i_1;
  Pager *pPager;
  Btree *pBt;
  int i;
  int totalUsed;
  int rc;
  int resetFlag_local;
  int *pHighwater_local;
  int *pCurrent_local;
  sqlite3 *psStack_10;
  int op_local;
  sqlite3 *db_local;
  
  i = 0;
  totalUsed = resetFlag;
  _rc = pHighwater;
  pHighwater_local = pCurrent;
  pCurrent_local._4_4_ = op;
  psStack_10 = db;
  sqlite3_mutex_enter(db->mutex);
  switch(pCurrent_local._4_4_) {
  case 0:
    *pHighwater_local = (psStack_10->lookaside).nOut;
    *_rc = (psStack_10->lookaside).mxOut;
    if (totalUsed != 0) {
      (psStack_10->lookaside).mxOut = (psStack_10->lookaside).nOut;
    }
    break;
  case 1:
    pBt._4_4_ = 0;
    sqlite3BtreeEnterAll(psStack_10);
    for (pBt._0_4_ = 0; (int)pBt < psStack_10->nDb; pBt._0_4_ = (int)pBt + 1) {
      pPager = (Pager *)psStack_10->aDb[(int)pBt].pBt;
      if (pPager != (Pager *)0x0) {
        _nByte = sqlite3BtreePager((Btree *)pPager);
        iVar1 = sqlite3PagerMemUsed(_nByte);
        pBt._4_4_ = iVar1 + pBt._4_4_;
      }
    }
    sqlite3BtreeLeaveAll(psStack_10);
    *pHighwater_local = pBt._4_4_;
    *_rc = 0;
    break;
  case 2:
    pSchema._0_4_ = 0;
    sqlite3BtreeEnterAll(psStack_10);
    psStack_10->pnBytesFreed = (int *)&pSchema;
    for (pSchema._4_4_ = 0; pSchema._4_4_ < psStack_10->nDb; pSchema._4_4_ = pSchema._4_4_ + 1) {
      p = (HashElem *)psStack_10->aDb[pSchema._4_4_].pSchema;
      if ((Schema *)p != (Schema *)0x0) {
        iVar1 = (*sqlite3Config.m.xRoundup)(0x28);
        pSchema._0_4_ =
             iVar1 * (*(int *)((long)&p->prev + 4) + *(int *)((long)&p[1].data + 4) +
                      *(int *)&p->field_0x24 + *(int *)((long)&p[2].next + 4)) + (int)pSchema;
        iVar1 = sqlite3MallocSize(p->pKey);
        pSchema._0_4_ = iVar1 + (int)pSchema;
        iVar1 = sqlite3MallocSize(*(void **)&p[1].nKey);
        pSchema._0_4_ = iVar1 + (int)pSchema;
        iVar1 = sqlite3MallocSize(p[1].prev);
        pSchema._0_4_ = iVar1 + (int)pSchema;
        iVar1 = sqlite3MallocSize(p[2].data);
        pSchema._0_4_ = iVar1 + (int)pSchema;
        for (pVdbe = (Vdbe *)p[1].pKey; pVdbe != (Vdbe *)0x0; pVdbe = (Vdbe *)pVdbe->db) {
          sqlite3DeleteTrigger(psStack_10,(Trigger *)pVdbe->aMem);
        }
        for (pVdbe = (Vdbe *)p->data; pVdbe != (Vdbe *)0x0; pVdbe = (Vdbe *)pVdbe->db) {
          sqlite3DeleteTable(psStack_10,(Table *)pVdbe->aMem);
        }
      }
    }
    psStack_10->pnBytesFreed = (int *)0x0;
    sqlite3BtreeLeaveAll(psStack_10);
    *_rc = 0;
    *pHighwater_local = (int)pSchema;
    break;
  case 3:
    nRet = 0;
    psStack_10->pnBytesFreed = &nRet;
    for (_i_2 = psStack_10->pVdbe; _i_2 != (Vdbe *)0x0; _i_2 = _i_2->pNext) {
      sqlite3VdbeClearObject(psStack_10,_i_2);
      sqlite3DbFree(psStack_10,_i_2);
    }
    psStack_10->pnBytesFreed = (int *)0x0;
    *_rc = 0;
    *pHighwater_local = nRet;
    break;
  case 4:
  case 5:
  case 6:
    *pHighwater_local = 0;
    *_rc = (psStack_10->lookaside).anStat[pCurrent_local._4_4_ + -4];
    if (totalUsed != 0) {
      (psStack_10->lookaside).anStat[pCurrent_local._4_4_ + -4] = 0;
    }
    break;
  case 7:
  case 8:
  case 9:
    pPager_1._4_4_ = 0;
    for (local_70 = 0; local_70 < psStack_10->nDb; local_70 = local_70 + 1) {
      if (psStack_10->aDb[local_70].pBt != (Btree *)0x0) {
        pPager_00 = sqlite3BtreePager(psStack_10->aDb[local_70].pBt);
        sqlite3PagerCacheStat(pPager_00,pCurrent_local._4_4_,totalUsed,(int *)((long)&pPager_1 + 4))
        ;
      }
    }
    *_rc = 0;
    *pHighwater_local = pPager_1._4_4_;
    break;
  default:
    i = 1;
  }
  sqlite3_mutex_leave(psStack_10->mutex);
  return i;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = db->lookaside.nOut;
      *pHighwater = db->lookaside.mxOut;
      if( resetFlag ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /* 
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          totalUsed += sqlite3PagerMemUsed(pPager);
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count 
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3MallocSize(pSchema->tblHash.ht);
          nByte += sqlite3MallocSize(pSchema->trigHash.ht);
          nByte += sqlite3MallocSize(pSchema->idxHash.ht);
          nByte += sqlite3MallocSize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pNext){
        sqlite3VdbeClearObject(db, pVdbe);
        sqlite3DbFree(db, pVdbe);
      }
      db->pnBytesFreed = 0;

      *pHighwater = 0;
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set 
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0;
      *pCurrent = nRet;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}